

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O2

uint __thiscall NetworkNS::RanMars::uint_rand(RanMars *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  iVar1 = this->x * 0x12bf507d;
  this->x = iVar1 + 0x12d687;
  uVar3 = this->y << 5 ^ this->y;
  uVar3 = uVar3 >> 7 ^ uVar3;
  uVar3 = uVar3 << 0x16 ^ uVar3;
  this->y = uVar3;
  lVar2 = (ulong)this->c + (ulong)this->z * 0xfffa2849;
  *(long *)&this->z = lVar2;
  return iVar1 + uVar3 + 0x12d687 + (int)lVar2;
}

Assistant:

unsigned int RanMars::uint_rand()
    {
        unsigned long long t;
        x = 314527869 * x + 1234567;
        y ^= y << 5;
        y ^= y >> 7;
        y ^= y << 22;
        t = 4294584393ULL * z + c;
        c = t >> 32;
        z = t;
        return x + y + z;
    }